

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

char * lws_get_urlarg_by_name(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  size_t sVar2;
  int frag_idx;
  
  sVar2 = strlen(name);
  frag_idx = 0;
  do {
    iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,frag_idx);
    if (iVar1 < 0) {
      return (char *)0x0;
    }
    iVar1 = strncmp(buf,name,(long)(int)sVar2);
    frag_idx = frag_idx + 1;
  } while (iVar1 != 0);
  return buf + (int)sVar2;
}

Assistant:

const char *
lws_get_urlarg_by_name(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, sl = (int)strlen(name);

	while (lws_hdr_copy_fragment(wsi, buf, len,
			  WSI_TOKEN_HTTP_URI_ARGS, n) >= 0) {

		if (!strncmp(buf, name, sl))
			return buf + sl;

		n++;
	}

	return NULL;
}